

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plain_visualization.cpp
# Opt level: O3

void __thiscall lumeview::PlainVisualization::refresh(PlainVisualization *this)

{
  Renderer *this_00;
  Mesh *pMVar1;
  bool bVar2;
  SPMesh bndMesh;
  _Any_data local_1e8;
  code *local_1d8;
  code *local_1d0;
  Mesh *local_1c8;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_1c0;
  _Any_data local_1b8;
  code *local_1a8;
  code *local_1a0;
  SPMesh local_198;
  SPMesh local_188;
  SPMesh local_178;
  SPMesh local_168;
  SPMesh local_158;
  SPMesh local_148;
  SPMesh local_138;
  SPMesh local_128;
  anon_union_16_4_ea85571f_for_tvec4<float,_(glm::precision)0>_2 local_118;
  string local_108;
  string local_e8;
  string local_c8;
  string local_a8;
  string local_88;
  string local_68;
  anon_union_16_4_ea85571f_for_tvec4<float,_(glm::precision)0>_2 local_48;
  anon_union_16_4_ea85571f_for_tvec4<float,_(glm::precision)0>_2 local_38;
  
  this_00 = &this->m_renderer;
  Renderer::clear(this_00);
  local_48._0_8_ = 0x3f57ced93f800000;
  local_48._8_8_ = 0x3f80000000000000;
  local_118._0_8_ = 0x3e4ccccd3e4ccccd;
  local_118._8_8_ = 0x3f8000003e4ccccd;
  local_38._0_8_ = 0x3e4ccccd3f800000;
  local_38._8_8_ = 0x3f8000003e4ccccd;
  bVar2 = lume::Mesh::has((this->m_mesh).super___shared_ptr<lume::Mesh,_(__gnu_cxx::_Lock_policy)2>.
                          _M_ptr,(GrobSet)0x3b);
  if (bVar2) {
    local_128.super___shared_ptr<lume::Mesh,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (this->m_mesh).super___shared_ptr<lume::Mesh,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    local_128.super___shared_ptr<lume::Mesh,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (this->m_mesh).super___shared_ptr<lume::Mesh,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
    ;
    if (local_128.super___shared_ptr<lume::Mesh,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        (local_128.super___shared_ptr<lume::Mesh,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
        _M_use_count = (local_128.super___shared_ptr<lume::Mesh,_(__gnu_cxx::_Lock_policy)2>.
                        _M_refcount._M_pi)->_M_use_count + 1;
        UNLOCK();
      }
      else {
        (local_128.super___shared_ptr<lume::Mesh,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
        _M_use_count = (local_128.super___shared_ptr<lume::Mesh,_(__gnu_cxx::_Lock_policy)2>.
                        _M_refcount._M_pi)->_M_use_count + 1;
      }
    }
    local_1e8._M_unused._M_object = (void *)0x0;
    local_1e8._8_8_ = 0;
    local_1d0 = std::
                _Function_handler<bool_(const_lume::GrobIndex_&),_lume::(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/sreiter[P]lumeview/deps/lume/include/lume/rim_mesh.h:56:36)>
                ::_M_invoke;
    local_1d8 = std::
                _Function_handler<bool_(const_lume::GrobIndex_&),_lume::(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/sreiter[P]lumeview/deps/lume/include/lume/rim_mesh.h:56:36)>
                ::_M_manager;
    local_1b8._M_unused._M_object = (void *)0x0;
    local_1b8._8_8_ = 0;
    local_1a0 = std::
                _Function_handler<void_(const_lume::GrobIndex_&,_const_lume::GrobIndex_&),_lume::(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/sreiter[P]lumeview/deps/lume/include/lume/rim_mesh.h:58:44)>
                ::_M_invoke;
    local_1a8 = std::
                _Function_handler<void_(const_lume::GrobIndex_&,_const_lume::GrobIndex_&),_lume::(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/sreiter[P]lumeview/deps/lume/include/lume/rim_mesh.h:58:44)>
                ::_M_manager;
    lume::CreateRimMesh((lume *)&local_1c8,&local_128,(GrobSet)0x3b,
                        (function<bool_(const_lume::GrobIndex_&)> *)&local_1e8,
                        (function<void_(const_lume::GrobIndex_&,_const_lume::GrobIndex_&)> *)
                        &local_1b8,(Neighborhoods *)0x0);
    if (local_1a8 != (code *)0x0) {
      (*local_1a8)(&local_1b8,&local_1b8,__destroy_functor);
    }
    if (local_1d8 != (code *)0x0) {
      (*local_1d8)(&local_1e8,&local_1e8,3);
    }
    if (local_128.super___shared_ptr<lume::Mesh,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_128.super___shared_ptr<lume::Mesh,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                 _M_pi);
    }
    pMVar1 = local_1c8;
    local_1e8._M_unused._M_object = &local_1d8;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_1e8,"normals","");
    lume::ComputeFaceVertexNormals3(pMVar1,(string *)&local_1e8);
    if ((code **)local_1e8._M_unused._0_8_ != &local_1d8) {
      operator_delete(local_1e8._M_unused._M_object,(ulong)(local_1d8 + 1));
    }
    lume::CreateSideGrobs(local_1c8,1);
    local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_68,"solid","");
    local_138.super___shared_ptr<lume::Mesh,_(__gnu_cxx::_Lock_policy)2>._M_ptr = local_1c8;
    local_138.super___shared_ptr<lume::Mesh,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         local_1c0;
    if (local_1c0 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        local_1c0->_M_use_count = local_1c0->_M_use_count + 1;
        UNLOCK();
      }
      else {
        local_1c0->_M_use_count = local_1c0->_M_use_count + 1;
      }
    }
    Renderer::add_stage(this_00,&local_68,&local_138,(GrobSet)0x34,FLAT);
    if (local_138.super___shared_ptr<lume::Mesh,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_138.super___shared_ptr<lume::Mesh,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                 _M_pi);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_68._M_dataplus._M_p != &local_68.field_2) {
      operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
    }
    Renderer::stage_set_color(this_00,(vec4 *)&local_48.field_0,-1);
    local_88._M_dataplus._M_p = (pointer)&local_88.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_88,"wire","");
    local_148.super___shared_ptr<lume::Mesh,_(__gnu_cxx::_Lock_policy)2>._M_ptr = local_1c8;
    local_148.super___shared_ptr<lume::Mesh,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         local_1c0;
    if (local_1c0 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        local_1c0->_M_use_count = local_1c0->_M_use_count + 1;
        UNLOCK();
      }
      else {
        local_1c0->_M_use_count = local_1c0->_M_use_count + 1;
      }
    }
    Renderer::add_stage(this_00,&local_88,&local_148,(GrobSet)0x4,FLAT);
    if (local_148.super___shared_ptr<lume::Mesh,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_148.super___shared_ptr<lume::Mesh,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                 _M_pi);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_88._M_dataplus._M_p != &local_88.field_2) {
      operator_delete(local_88._M_dataplus._M_p,local_88.field_2._M_allocated_capacity + 1);
    }
    Renderer::stage_set_color(this_00,(vec4 *)&local_118.field_0,-1);
  }
  else {
    bVar2 = lume::Mesh::has((this->m_mesh).
                            super___shared_ptr<lume::Mesh,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
                            (GrobSet)0x34);
    pMVar1 = (this->m_mesh).super___shared_ptr<lume::Mesh,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    if (!bVar2) {
      bVar2 = lume::Mesh::has(pMVar1,(GrobSet)0x4);
      if (!bVar2) {
        return;
      }
      pMVar1 = (this->m_mesh).super___shared_ptr<lume::Mesh,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      local_1e8._M_unused._M_object = &local_1d8;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_1e8,"normals","");
      lume::ComputeFaceVertexNormals3(pMVar1,(string *)&local_1e8);
      if ((code **)local_1e8._M_unused._0_8_ != &local_1d8) {
        operator_delete(local_1e8._M_unused._M_object,(ulong)(local_1d8 + 1));
      }
      local_108._M_dataplus._M_p = (pointer)&local_108.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_108,"wire","");
      local_198.super___shared_ptr<lume::Mesh,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (this->m_mesh).super___shared_ptr<lume::Mesh,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      local_198.super___shared_ptr<lume::Mesh,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
           (this->m_mesh).super___shared_ptr<lume::Mesh,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
           _M_pi;
      if (local_198.super___shared_ptr<lume::Mesh,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          (local_198.super___shared_ptr<lume::Mesh,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
          _M_use_count = (local_198.super___shared_ptr<lume::Mesh,_(__gnu_cxx::_Lock_policy)2>.
                          _M_refcount._M_pi)->_M_use_count + 1;
          UNLOCK();
        }
        else {
          (local_198.super___shared_ptr<lume::Mesh,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
          _M_use_count = (local_198.super___shared_ptr<lume::Mesh,_(__gnu_cxx::_Lock_policy)2>.
                          _M_refcount._M_pi)->_M_use_count + 1;
        }
      }
      Renderer::add_stage(this_00,&local_108,&local_198,(GrobSet)0x4,NONE);
      if (local_198.super___shared_ptr<lume::Mesh,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_198.super___shared_ptr<lume::Mesh,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                   _M_pi);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_108._M_dataplus._M_p != &local_108.field_2) {
        operator_delete(local_108._M_dataplus._M_p,local_108.field_2._M_allocated_capacity + 1);
      }
      Renderer::stage_set_color(this_00,(vec4 *)&local_118.field_0,-1);
      return;
    }
    local_1e8._M_unused._M_object = &local_1d8;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_1e8,"normals","");
    lume::ComputeFaceVertexNormals3(pMVar1,(string *)&local_1e8);
    if ((code **)local_1e8._M_unused._0_8_ != &local_1d8) {
      operator_delete(local_1e8._M_unused._M_object,(ulong)(local_1d8 + 1));
    }
    lume::CreateSideGrobs
              ((this->m_mesh).super___shared_ptr<lume::Mesh,_(__gnu_cxx::_Lock_policy)2>._M_ptr,1);
    local_a8._M_dataplus._M_p = (pointer)&local_a8.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_a8,"solid","");
    local_158.super___shared_ptr<lume::Mesh,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (this->m_mesh).super___shared_ptr<lume::Mesh,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    local_158.super___shared_ptr<lume::Mesh,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (this->m_mesh).super___shared_ptr<lume::Mesh,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
    ;
    if (local_158.super___shared_ptr<lume::Mesh,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        (local_158.super___shared_ptr<lume::Mesh,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
        _M_use_count = (local_158.super___shared_ptr<lume::Mesh,_(__gnu_cxx::_Lock_policy)2>.
                        _M_refcount._M_pi)->_M_use_count + 1;
        UNLOCK();
      }
      else {
        (local_158.super___shared_ptr<lume::Mesh,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
        _M_use_count = (local_158.super___shared_ptr<lume::Mesh,_(__gnu_cxx::_Lock_policy)2>.
                        _M_refcount._M_pi)->_M_use_count + 1;
      }
    }
    Renderer::add_stage(this_00,&local_a8,&local_158,(GrobSet)0x34,FLAT);
    if (local_158.super___shared_ptr<lume::Mesh,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_158.super___shared_ptr<lume::Mesh,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                 _M_pi);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_a8._M_dataplus._M_p != &local_a8.field_2) {
      operator_delete(local_a8._M_dataplus._M_p,local_a8.field_2._M_allocated_capacity + 1);
    }
    Renderer::stage_set_color(this_00,(vec4 *)&local_48.field_0,-1);
    local_c8._M_dataplus._M_p = (pointer)&local_c8.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_c8,"wire","");
    local_168.super___shared_ptr<lume::Mesh,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (this->m_mesh).super___shared_ptr<lume::Mesh,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    local_168.super___shared_ptr<lume::Mesh,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (this->m_mesh).super___shared_ptr<lume::Mesh,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
    ;
    if (local_168.super___shared_ptr<lume::Mesh,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        (local_168.super___shared_ptr<lume::Mesh,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
        _M_use_count = (local_168.super___shared_ptr<lume::Mesh,_(__gnu_cxx::_Lock_policy)2>.
                        _M_refcount._M_pi)->_M_use_count + 1;
        UNLOCK();
      }
      else {
        (local_168.super___shared_ptr<lume::Mesh,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
        _M_use_count = (local_168.super___shared_ptr<lume::Mesh,_(__gnu_cxx::_Lock_policy)2>.
                        _M_refcount._M_pi)->_M_use_count + 1;
      }
    }
    Renderer::add_stage(this_00,&local_c8,&local_168,(GrobSet)0x4,FLAT);
    if (local_168.super___shared_ptr<lume::Mesh,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_168.super___shared_ptr<lume::Mesh,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                 _M_pi);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_c8._M_dataplus._M_p != &local_c8.field_2) {
      operator_delete(local_c8._M_dataplus._M_p,local_c8.field_2._M_allocated_capacity + 1);
    }
    Renderer::stage_set_color(this_00,(vec4 *)&local_118.field_0,-1);
    local_178.super___shared_ptr<lume::Mesh,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (this->m_mesh).super___shared_ptr<lume::Mesh,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    local_178.super___shared_ptr<lume::Mesh,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (this->m_mesh).super___shared_ptr<lume::Mesh,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
    ;
    if (local_178.super___shared_ptr<lume::Mesh,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        (local_178.super___shared_ptr<lume::Mesh,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
        _M_use_count = (local_178.super___shared_ptr<lume::Mesh,_(__gnu_cxx::_Lock_policy)2>.
                        _M_refcount._M_pi)->_M_use_count + 1;
        UNLOCK();
      }
      else {
        (local_178.super___shared_ptr<lume::Mesh,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
        _M_use_count = (local_178.super___shared_ptr<lume::Mesh,_(__gnu_cxx::_Lock_policy)2>.
                        _M_refcount._M_pi)->_M_use_count + 1;
      }
    }
    local_1e8._M_unused._M_object = (code **)0x0;
    local_1e8._8_8_ = 0;
    local_1d0 = std::
                _Function_handler<bool_(const_lume::GrobIndex_&),_lume::(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/sreiter[P]lumeview/deps/lume/include/lume/rim_mesh.h:56:36)>
                ::_M_invoke;
    local_1d8 = std::
                _Function_handler<bool_(const_lume::GrobIndex_&),_lume::(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/sreiter[P]lumeview/deps/lume/include/lume/rim_mesh.h:56:36)>
                ::_M_manager;
    local_1b8._M_unused._M_object = (void *)0x0;
    local_1b8._8_8_ = 0;
    local_1a0 = std::
                _Function_handler<void_(const_lume::GrobIndex_&,_const_lume::GrobIndex_&),_lume::(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/sreiter[P]lumeview/deps/lume/include/lume/rim_mesh.h:58:44)>
                ::_M_invoke;
    local_1a8 = std::
                _Function_handler<void_(const_lume::GrobIndex_&,_const_lume::GrobIndex_&),_lume::(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/sreiter[P]lumeview/deps/lume/include/lume/rim_mesh.h:58:44)>
                ::_M_manager;
    lume::CreateRimMesh((lume *)&local_1c8,&local_178,(GrobSet)0x34,
                        (function<bool_(const_lume::GrobIndex_&)> *)&local_1e8,
                        (function<void_(const_lume::GrobIndex_&,_const_lume::GrobIndex_&)> *)
                        &local_1b8,(Neighborhoods *)0x0);
    if (local_1a8 != (code *)0x0) {
      (*local_1a8)(&local_1b8,&local_1b8,__destroy_functor);
    }
    if (local_1d8 != (code *)0x0) {
      (*local_1d8)(&local_1e8,&local_1e8,3);
    }
    if (local_178.super___shared_ptr<lume::Mesh,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_178.super___shared_ptr<lume::Mesh,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                 _M_pi);
    }
    bVar2 = lume::Mesh::has(local_1c8,(GrobSet)0x4);
    if (bVar2) {
      local_e8._M_dataplus._M_p = (pointer)&local_e8.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_e8,"bnd","");
      local_188.super___shared_ptr<lume::Mesh,_(__gnu_cxx::_Lock_policy)2>._M_ptr = local_1c8;
      local_188.super___shared_ptr<lume::Mesh,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
           local_1c0;
      if (local_1c0 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          local_1c0->_M_use_count = local_1c0->_M_use_count + 1;
          UNLOCK();
        }
        else {
          local_1c0->_M_use_count = local_1c0->_M_use_count + 1;
        }
      }
      Renderer::add_stage(this_00,&local_e8,&local_188,(GrobSet)0x4,NONE);
      if (local_188.super___shared_ptr<lume::Mesh,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_188.super___shared_ptr<lume::Mesh,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                   _M_pi);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_e8._M_dataplus._M_p != &local_e8.field_2) {
        operator_delete(local_e8._M_dataplus._M_p,local_e8.field_2._M_allocated_capacity + 1);
      }
      Renderer::stage_set_color(this_00,(vec4 *)&local_38.field_0,-1);
    }
  }
  if (local_1c0 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_1c0);
  }
  return;
}

Assistant:

void PlainVisualization::
refresh ()
{
	m_renderer.clear();

	const glm::vec4 solidColor (1.0f, 0.843f, 0.f, 1.0f);
	const glm::vec4 wireColor (0.2f, 0.2f, 0.2f, 1.0f);
	const glm::vec4 bndColor (1.0f, 0.2f, 0.2f, 1.0f);

	if (m_mesh->has (CELLS)) {
		auto bndMesh = CreateRimMesh (m_mesh, CELLS);
		ComputeFaceVertexNormals3 (*bndMesh, "normals");
		CreateSideGrobs (*bndMesh, 1);
		m_renderer.add_stage ("solid", bndMesh, FACES, FLAT);
		m_renderer.stage_set_color (solidColor);
		m_renderer.add_stage ("wire", bndMesh, EDGES, FLAT);
		m_renderer.stage_set_color (wireColor);
	}
	else if (m_mesh->has (FACES)) {
		ComputeFaceVertexNormals3 (*m_mesh, "normals");
		CreateSideGrobs (*m_mesh, 1);
		m_renderer.add_stage ("solid", m_mesh, FACES, FLAT);
		m_renderer.stage_set_color (solidColor);
		m_renderer.add_stage ("wire", m_mesh, EDGES, FLAT);
		m_renderer.stage_set_color (wireColor);
		auto bndMesh = CreateRimMesh (m_mesh, FACES);
		if (bndMesh->has (EDGES)) {
			m_renderer.add_stage ("bnd", bndMesh, EDGES, NONE);
			m_renderer.stage_set_color (bndColor);
		}
	}
	else if (m_mesh->has (EDGES)) {
		ComputeFaceVertexNormals3 (*m_mesh, "normals");
		m_renderer.add_stage ("wire", m_mesh, EDGES, NONE);
		m_renderer.stage_set_color (wireColor);
	}
}